

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O3

void xmlXPtrRangeCheckOrder(xmlXPathObjectPtr range)

{
  xmlNodePtr node2;
  xmlNodePtr node1;
  void *pvVar1;
  int iVar2;
  
  if ((((range != (xmlXPathObjectPtr)0x0) && (range->type == XPATH_RANGE)) &&
      (node2 = (xmlNodePtr)range->user2, node2 != (xmlNodePtr)0x0)) &&
     (node1 = (xmlNodePtr)range->user, node1 != (xmlNodePtr)0x0)) {
    if (node1 == node2) {
      if (range->index <= range->index2) {
        return;
      }
    }
    else {
      iVar2 = xmlXPathCmpNodes(node1,node2);
      if (iVar2 != -1) {
        return;
      }
    }
    pvVar1 = range->user;
    range->user = range->user2;
    range->user2 = pvVar1;
    iVar2 = range->index;
    range->index = range->index2;
    range->index2 = iVar2;
  }
  return;
}

Assistant:

static void
xmlXPtrRangeCheckOrder(xmlXPathObjectPtr range) {
    int tmp;
    xmlNodePtr tmp2;
    if (range == NULL)
	return;
    if (range->type != XPATH_RANGE)
	return;
    if (range->user2 == NULL)
	return;
    tmp = xmlXPtrCmpPoints(range->user, range->index,
	                     range->user2, range->index2);
    if (tmp == -1) {
	tmp2 = range->user;
	range->user = range->user2;
	range->user2 = tmp2;
	tmp = range->index;
	range->index = range->index2;
	range->index2 = tmp;
    }
}